

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReaderCache::purge(PtexReaderCache *this,PtexTexture *texture)

{
  int iVar1;
  bool bVar2;
  
  LOCK();
  *(int *)&texture[0x5a]._vptr_PtexTexture = *(int *)&texture[0x5a]._vptr_PtexTexture + -1;
  UNLOCK();
  purge(this,(PtexCachedReader *)texture);
  do {
    do {
      iVar1 = *(int *)&texture[0x5a]._vptr_PtexTexture;
    } while (iVar1 < 0);
    LOCK();
    bVar2 = iVar1 == *(int *)&texture[0x5a]._vptr_PtexTexture;
    if (bVar2) {
      *(int *)&texture[0x5a]._vptr_PtexTexture = iVar1 + 1;
    }
    UNLOCK();
  } while (!bVar2);
  return;
}

Assistant:

void PtexReaderCache::purge(PtexTexture* texture)
{
    PtexCachedReader* reader = static_cast<PtexCachedReader*>(texture);
    reader->unref();
    purge(reader);
    reader->ref();
}